

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# get_perm_c.c
# Opt level: O1

void get_perm_c(int ispec,SuperMatrix *A,int *perm_c)

{
  int m;
  int_t iVar1;
  int_t *piVar2;
  int_t *llist;
  int_t *marker;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  int n;
  int_t delta;
  int_t bnz;
  int_t *b_colptr;
  int_t *b_rowind;
  int_t maxint;
  int_t *local_148;
  int *local_140;
  int_t nofsub;
  
  piVar2 = (int_t *)A->Store;
  bnz = 0;
  m = A->nrow;
  n = A->ncol;
  SuperLU_timer_();
  switch(ispec) {
  case 0:
    if ((long)n < 1) {
      return;
    }
    lVar3 = 0;
    do {
      perm_c[lVar3] = (int)lVar3;
      lVar3 = lVar3 + 1;
    } while (n != lVar3);
    return;
  case 1:
    getata(m,n,*piVar2,*(int_t **)(piVar2 + 6),*(int_t **)(piVar2 + 4),&bnz,&b_colptr,&b_rowind);
    break;
  case 2:
    if (m != n) {
      sprintf((char *)&nofsub,"%s at line %d in file %s\n","Matrix is not square",0x1ca,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit((char *)&nofsub);
    }
    at_plus_a(n,*piVar2,*(int_t **)(piVar2 + 6),*(int_t **)(piVar2 + 4),&bnz,&b_colptr,&b_rowind);
    break;
  case 3:
    get_colamd(m,n,*piVar2,*(int_t **)(piVar2 + 6),*(int_t **)(piVar2 + 4),perm_c);
    return;
  default:
    sprintf((char *)&nofsub,"%s at line %d in file %s\n","Invalid ISPEC",0x1fe,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c")
    ;
    superlu_abort_and_exit((char *)&nofsub);
    goto LAB_0010f8e1;
  }
  SuperLU_timer_();
LAB_0010f8e1:
  iVar1 = bnz;
  uVar5 = (ulong)(uint)bnz;
  if (uVar5 == 0) {
    if (0 < (long)n) {
      lVar3 = 0;
      do {
        perm_c[lVar3] = (int)lVar3;
        lVar3 = lVar3 + 1;
      } while (n != lVar3);
    }
  }
  else {
    SuperLU_timer_();
    delta = 0;
    maxint = 0x7fffffff;
    local_140 = (int *)superlu_malloc((long)n << 2);
    if (local_140 == (int *)0x0) {
      sprintf((char *)&nofsub,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for invp.",0x209,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit((char *)&nofsub);
    }
    local_148 = intMalloc(delta + n);
    if (local_148 == (int_t *)0x0) {
      sprintf((char *)&nofsub,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for dhead.",0x20b,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit((char *)&nofsub);
    }
    piVar2 = intMalloc(delta + n);
    if (piVar2 == (int_t *)0x0) {
      sprintf((char *)&nofsub,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for qsize.",0x20d,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit((char *)&nofsub);
    }
    llist = intMalloc(n);
    if (llist == (int_t *)0x0) {
      sprintf((char *)&nofsub,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for llist.",0x20f,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit((char *)&nofsub);
    }
    marker = intMalloc(n);
    if (marker == (int_t *)0x0) {
      sprintf((char *)&nofsub,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for marker.",0x211,
              "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/get_perm_c.c"
             );
      superlu_abort_and_exit((char *)&nofsub);
    }
    if (-1 < n) {
      lVar3 = -1;
      do {
        b_colptr[lVar3 + 1] = b_colptr[lVar3 + 1] + 1;
        lVar3 = lVar3 + 1;
      } while (lVar3 < n);
    }
    if (0 < iVar1) {
      uVar4 = 0;
      do {
        b_rowind[uVar4] = b_rowind[uVar4] + 1;
        uVar4 = uVar4 + 1;
      } while (uVar5 != uVar4);
    }
    genmmd_(&n,b_colptr,b_rowind,perm_c,local_140,&delta,local_148,piVar2,llist,marker,&maxint,
            &nofsub);
    if (0 < (long)n) {
      lVar3 = 0;
      do {
        perm_c[lVar3] = perm_c[lVar3] + -1;
        lVar3 = lVar3 + 1;
      } while (n != lVar3);
    }
    superlu_free(local_140);
    superlu_free(local_148);
    superlu_free(piVar2);
    superlu_free(llist);
    superlu_free(marker);
    superlu_free(b_rowind);
    SuperLU_timer_();
  }
  superlu_free(b_colptr);
  return;
}

Assistant:

void
get_perm_c(int ispec, SuperMatrix *A, int *perm_c)
{
    NCformat *Astore = A->Store;
    int m, n;
    int_t i, bnz = 0, *b_colptr, *b_rowind;
    int_t delta, maxint, nofsub;
    int *invp;
    int_t *dhead, *qsize, *llist, *marker;
    double t;
    
    m = A->nrow;
    n = A->ncol;

    t = SuperLU_timer_();
    switch ( ispec ) {
    case (NATURAL): /* Natural ordering */
	for (i = 0; i < n; ++i) perm_c[i] = i;
#if ( PRNTlevel>=1 )
	printf("Use natural column ordering.\n");
#endif
	return;
    case (MMD_ATA): /* Minimum degree ordering on A'*A */
	getata(m, n, Astore->nnz, Astore->colptr, Astore->rowind,
		     &bnz, &b_colptr, &b_rowind);
#if ( PRNTlevel>=1 )
	printf("Use minimum degree ordering on A'*A.\n");
#endif
	t = SuperLU_timer_() - t;
	/*printf("Form A'*A time = %8.3f\n", t);*/
	break;
    case (MMD_AT_PLUS_A): /* Minimum degree ordering on A'+A */
	if ( m != n ) ABORT("Matrix is not square");
	at_plus_a(n, Astore->nnz, Astore->colptr, Astore->rowind,
		  &bnz, &b_colptr, &b_rowind);
#if ( PRNTlevel>=1 )
	printf("Use minimum degree ordering on A'+A.\n");
#endif
	t = SuperLU_timer_() - t;
	/*printf("Form A'+A time = %8.3f\n", t);*/
	break;
    case (COLAMD): /* Approximate minimum degree column ordering. */
	get_colamd(m, n, Astore->nnz, Astore->colptr, Astore->rowind, perm_c);
#if ( PRNTlevel>=1 )
	printf(".. Use approximate minimum degree column ordering.\n");
#endif
	return;
#ifdef HAVE_METIS
    case METIS_ATA: /* METIS ordering on A'*A */
	    getata(m, n, Astore->nnz, Astore->colptr, Astore->rowind,
		     &bnz, &b_colptr, &b_rowind);

	    if ( bnz ) { /* non-empty adjacency structure */
		  get_metis(n, bnz, b_colptr, b_rowind, perm_c);
	    } else { /* e.g., diagonal matrix */
		for (i = 0; i < n; ++i) perm_c[i] = i;
		SUPERLU_FREE(b_colptr);
		/* b_rowind is not allocated in this case */
	    }

#if ( PRNTlevel>=1 )
	    printf(".. Use METIS ordering on A'*A\n");
#endif
	    return;
    case METIS_AT_PLUS_A: /* METIS ordering on A'*A */
	if ( m != n ) ABORT("Matrix is not square");
	at_plus_a(n, Astore->nnz, Astore->colptr, Astore->rowind,
		  &bnz, &b_colptr, &b_rowind);

        if ( bnz ) { /* non-empty adjacency structure */
	    get_metis(n, bnz, b_colptr, b_rowind, perm_c);
        } else { /* e.g., diagonal matrix */
	    for (i = 0; i < n; ++i) perm_c[i] = i;
		SUPERLU_FREE(b_colptr);
	    /* b_rowind is not allocated in this case */
	}

#if ( PRNTlevel>=1 )
	printf(".. Use METIS ordering on A'+A\n");
#endif
	return;
#endif
	
    default:
	ABORT("Invalid ISPEC");
    }

    if ( bnz != 0 ) {
	t = SuperLU_timer_();

	/* Initialize and allocate storage for GENMMD. */
	delta = 0; /* DELTA is a parameter to allow the choice of nodes
		      whose degree <= min-degree + DELTA. */
	maxint = 2147483647; /* 2**31 - 1 */
	invp = (int *) SUPERLU_MALLOC((n+delta)*sizeof(int));
	if ( !invp ) ABORT("SUPERLU_MALLOC fails for invp.");
	dhead = intMalloc(n+delta);
	if ( !dhead ) ABORT("SUPERLU_MALLOC fails for dhead.");
	qsize = intMalloc(n+delta);
	if ( !qsize ) ABORT("SUPERLU_MALLOC fails for qsize.");
	llist = intMalloc(n);
	if ( !llist ) ABORT("SUPERLU_MALLOC fails for llist.");
	marker = intMalloc(n);
	if ( !marker ) ABORT("SUPERLU_MALLOC fails for marker.");

	/* Transform adjacency list into 1-based indexing required by GENMMD.*/
	for (i = 0; i <= n; ++i) ++b_colptr[i];
	for (i = 0; i < bnz; ++i) ++b_rowind[i];
	
	genmmd_(&n, b_colptr, b_rowind, perm_c, invp, &delta, dhead, 
		qsize, llist, marker, &maxint, &nofsub);

	/* Transform perm_c into 0-based indexing. */
	for (i = 0; i < n; ++i) --perm_c[i];

	SUPERLU_FREE(invp);
	SUPERLU_FREE(dhead);
	SUPERLU_FREE(qsize);
	SUPERLU_FREE(llist);
	SUPERLU_FREE(marker);
	SUPERLU_FREE(b_rowind);

	t = SuperLU_timer_() - t;
	/*  printf("call GENMMD time = %8.3f\n", t);*/

    } else { /* Empty adjacency structure */
	for (i = 0; i < n; ++i) perm_c[i] = i;
    }

    SUPERLU_FREE(b_colptr);
}